

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t hufPackEncTable(uint64_t *hcode,uint32_t im,uint32_t iM,uint8_t **pcode,uint8_t *pend)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  uint64_t zerun;
  int l;
  int lc;
  uint64_t c;
  uint8_t *out;
  exr_result_t rv;
  ulong local_50;
  int local_44;
  uint64_t local_40;
  uint8_t *local_38;
  exr_result_t local_2c;
  uint8_t *local_28;
  undefined8 *local_20;
  uint local_18;
  uint local_14;
  long local_10;
  
  local_38 = (uint8_t *)*in_RCX;
  local_40 = 0;
  local_44 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  do {
    if (local_18 < local_14) {
      if (0 < local_44) {
        if (local_28 <= local_38) {
          return 4;
        }
        *local_38 = (uint8_t)(local_40 << (8U - (char)local_44 & 0x3f));
        local_38 = local_38 + 1;
      }
      *local_20 = local_38;
      return 0;
    }
    iVar1 = hufLength(*(uint64_t *)(local_10 + (ulong)local_14 * 8));
    if (iVar1 == 0) {
      local_50 = 1;
      while ((local_14 < local_18 && local_50 < 0x105 &&
             (iVar2 = hufLength(*(uint64_t *)(local_10 + (ulong)(local_14 + 1) * 8)), iVar2 < 1))) {
        local_14 = local_14 + 1;
        local_50 = local_50 + 1;
      }
      if (local_50 < 2) goto LAB_0012427d;
      if (local_50 < 6) {
        iVar1 = outputBits(6,local_50 + 0x39,&local_40,&local_44,&local_38,local_28);
      }
      else {
        local_2c = outputBits(6,0x3f,&local_40,&local_44,&local_38,local_28);
        if (local_2c != 0) {
          return local_2c;
        }
        iVar1 = outputBits(8,local_50 - 6,&local_40,&local_44,&local_38,local_28);
      }
    }
    else {
LAB_0012427d:
      iVar1 = outputBits(6,(long)iVar1,&local_40,&local_44,&local_38,local_28);
    }
    if (iVar1 != 0) {
      return iVar1;
    }
    local_2c = 0;
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static exr_result_t
hufPackEncTable (
    const uint64_t* hcode, // i : encoding table [HUF_ENCSIZE]
    uint32_t        im,    // i : min hcode index
    uint32_t        iM,    // i : max hcode index
    uint8_t**       pcode, // o : ptr to packed table (updated)
    uint8_t*        pend)  // i : max size of table
{
    exr_result_t rv;
    uint8_t* out = *pcode;
    uint64_t c   = 0;
    int      lc  = 0;

    for (; im <= iM; im++)
    {
        int l = hufLength (hcode[im]);

        if (l == 0)
        {
            uint64_t zerun = 1;

            while ((im < iM) && (zerun < LONGEST_LONG_RUN))
            {
                if (hufLength (hcode[im + 1]) > 0) break;
                im++;
                zerun++;
            }

            if (zerun >= 2)
            {
                if (zerun >= SHORTEST_LONG_RUN)
                {
                    rv = outputBits (6, LONG_ZEROCODE_RUN, &c, &lc, &out, pend);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                    rv = outputBits (8, zerun - SHORTEST_LONG_RUN, &c, &lc, &out, pend);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                else
                {
                    rv = outputBits (
                        6, SHORT_ZEROCODE_RUN + zerun - 2, &c, &lc, &out, pend);
                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                continue;
            }
        }

        rv = outputBits (6, (uint64_t) l, &c, &lc, &out, pend);
        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    if (lc > 0)
    {
        if (out >= pend) return EXR_ERR_ARGUMENT_OUT_OF_RANGE;
        *out++ = (uint8_t) (c << (8 - lc));
    }

    *pcode = out;
    return EXR_ERR_SUCCESS;
}